

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

void __thiscall
rigtorp::mpmc::Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_>::pop
          (Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_> *this,
          unsigned_long *v)

{
  atomic<unsigned_long> *paVar1;
  size_t sVar2;
  Slot<unsigned_long> *pSVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  Slot<unsigned_long> *slot;
  __int_type_conflict tail;
  unsigned_long *v_local;
  Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_> *this_local;
  memory_order __b;
  memory_order __b_1;
  
  paVar1 = &this->tail_;
  LOCK();
  sVar5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pSVar3 = this->slots_;
  sVar2 = idx(this,sVar5);
  pSVar3 = pSVar3 + sVar2;
  do {
    sVar2 = turn(this,sVar5);
    std::operator&(memory_order_acquire,__memory_order_mask);
  } while (sVar2 * 2 + 1 != (pSVar3->turn).super___atomic_base<unsigned_long>._M_i);
  puVar4 = Slot<unsigned_long>::move(pSVar3);
  *v = *puVar4;
  Slot<unsigned_long>::destroy(pSVar3);
  sVar5 = turn(this,sVar5);
  std::operator&(memory_order_release,__memory_order_mask);
  (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = sVar5 * 2 + 2;
  return;
}

Assistant:

void pop(T &v) noexcept {
    auto const tail = tail_.fetch_add(1);
    auto &slot = slots_[idx(tail)];
    while (turn(tail) * 2 + 1 != slot.turn.load(std::memory_order_acquire))
      ;
    v = slot.move();
    slot.destroy();
    slot.turn.store(turn(tail) * 2 + 2, std::memory_order_release);
  }